

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.hpp
# Opt level: O0

void __thiscall
optimization::sanity_check::SanityCheck::optimize_func(SanityCheck *this,MirFunction *func)

{
  bool bVar1;
  char *pcVar2;
  undefined8 *puVar3;
  void *pvVar4;
  uint extraout_EDX;
  long in_RSI;
  pointer_____offset_0x10___ *__s;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  PtrOffsetInst *x_9;
  VarId v_1;
  iterator __end13;
  iterator __begin13;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range13;
  PhiInst *x_8;
  RefInst *x_7;
  StoreOffsetInst *x_6;
  LoadOffsetInst *x_5;
  StoreInst *x_4;
  LoadInst *x_3;
  AssignInst *x_2;
  Value v;
  iterator __end6;
  iterator __begin6;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *__range6;
  CallInst *x_1;
  OpInst *x;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  pair<const_int,_mir::inst::BasicBlk> *bb;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  anon_class_8_1_a7bdd428 check_val;
  anon_class_8_1_898bcfc2 check;
  Value *in_stack_fffffffffffffc38;
  Value *in_stack_fffffffffffffc40;
  bad_cast *this_00;
  long local_3a8;
  type in_stack_fffffffffffffc60;
  Value *in_stack_fffffffffffffc68;
  type in_stack_fffffffffffffc70;
  long local_388;
  long local_378;
  long local_368;
  long local_358;
  long local_348;
  long local_338;
  long local_328;
  long local_318;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  local_278;
  undefined1 *local_270;
  Value *local_268;
  long local_230;
  long local_1e8;
  long local_1a0;
  long local_178;
  int in_stack_fffffffffffffe94;
  VarId *in_stack_fffffffffffffe98;
  anon_class_8_1_898bcfc2 *in_stack_fffffffffffffea0;
  __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
  local_d8;
  long local_d0;
  long local_c8;
  long local_80;
  pointer_____offset_0x10___ local_78 [2];
  type local_68;
  reference local_60;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_58;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_50;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  undefined1 *local_20;
  undefined1 local_18 [24];
  
  local_20 = local_18;
  local_28 = in_RSI + 0x68;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffc38);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffffc38);
  do {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      return;
    }
    local_40 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1384f0)
    ;
    local_48 = &(local_40->second).inst;
    local_50._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffffc38);
    local_58 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffffc38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffc40,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffc38), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_50);
      local_68 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffffc40);
      mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffc40,(VarId *)in_stack_fffffffffffffc38)
      ;
      __s = local_78;
      optimize_func::anon_class_8_1_898bcfc2::operator()
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
      if (local_68 == (type)0x0) {
        auVar5._4_8_ = 0;
        auVar5._0_4_ = extraout_EDX;
        auVar5 = auVar5 << 0x40;
      }
      else {
        __s = &mir::inst::Inst::typeinfo;
        auVar5 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo,0);
      }
      local_318 = auVar5._0_8_;
      local_80 = local_318;
      if (local_318 == 0) {
        if (local_68 == (type)0x0) {
          auVar6._4_8_ = 0;
          auVar6._0_4_ = auVar5._8_4_;
          auVar6 = auVar6 << 0x40;
        }
        else {
          __s = &mir::inst::Inst::typeinfo;
          auVar6 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,&mir::inst::CallInst::typeinfo
                                  ,0);
        }
        local_328 = auVar6._0_8_;
        local_c8 = local_328;
        if (local_328 == 0) {
          if (local_68 == (type)0x0) {
            auVar7._4_8_ = 0;
            auVar7._0_4_ = auVar6._8_4_;
            auVar7 = auVar7 << 0x40;
          }
          else {
            __s = &mir::inst::Inst::typeinfo;
            auVar7 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                    &mir::inst::AssignInst::typeinfo,0);
          }
          local_338 = auVar7._0_8_;
          if (local_338 == 0) {
            if (local_68 == (type)0x0) {
              auVar8._4_8_ = 0;
              auVar8._0_4_ = auVar7._8_4_;
              auVar8 = auVar8 << 0x40;
            }
            else {
              __s = &mir::inst::Inst::typeinfo;
              auVar8 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                      &mir::inst::LoadInst::typeinfo,0);
            }
            local_348 = auVar8._0_8_;
            if (local_348 == 0) {
              if (local_68 == (type)0x0) {
                auVar9._4_8_ = 0;
                auVar9._0_4_ = auVar8._8_4_;
                auVar9 = auVar9 << 0x40;
              }
              else {
                __s = &mir::inst::Inst::typeinfo;
                auVar9 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                        &mir::inst::StoreInst::typeinfo,0);
              }
              local_358 = auVar9._0_8_;
              local_178 = local_358;
              if (local_358 == 0) {
                if (local_68 == (type)0x0) {
                  auVar10._4_8_ = 0;
                  auVar10._0_4_ = auVar9._8_4_;
                  auVar10 = auVar10 << 0x40;
                }
                else {
                  __s = &mir::inst::Inst::typeinfo;
                  auVar10 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                           &mir::inst::LoadOffsetInst::typeinfo,0);
                }
                local_368 = auVar10._0_8_;
                local_1a0 = local_368;
                if (local_368 == 0) {
                  if (local_68 == (type)0x0) {
                    auVar11._4_8_ = 0;
                    auVar11._0_4_ = auVar10._8_4_;
                    auVar11 = auVar11 << 0x40;
                  }
                  else {
                    __s = &mir::inst::Inst::typeinfo;
                    auVar11 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                             &mir::inst::StoreOffsetInst::typeinfo,0);
                  }
                  local_378 = auVar11._0_8_;
                  local_1e8 = local_378;
                  if (local_378 == 0) {
                    if (local_68 == (type)0x0) {
                      auVar12._4_8_ = 0;
                      auVar12._0_4_ = auVar11._8_4_;
                      auVar12 = auVar12 << 0x40;
                    }
                    else {
                      __s = &mir::inst::Inst::typeinfo;
                      auVar12 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                               &mir::inst::RefInst::typeinfo,0);
                    }
                    local_388 = auVar12._0_8_;
                    local_230 = local_388;
                    if (local_388 == 0) {
                      in_stack_fffffffffffffc70 = local_68;
                      if (local_68 == (type)0x0) {
                        in_stack_fffffffffffffc68 = (Value *)0x0;
                      }
                      else {
                        in_stack_fffffffffffffc68 =
                             (Value *)__dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                                     &mir::inst::PhiInst::typeinfo,0);
                      }
                      local_268 = in_stack_fffffffffffffc68;
                      if (in_stack_fffffffffffffc68 == (Value *)0x0) {
                        in_stack_fffffffffffffc60 = local_68;
                        if (local_68 == (type)0x0) {
                          local_3a8 = 0;
                        }
                        else {
                          local_3a8 = __dynamic_cast(local_68,&mir::inst::Inst::typeinfo,
                                                     &mir::inst::PtrOffsetInst::typeinfo,0);
                        }
                        if (local_3a8 == 0) {
                          this_00 = (bad_cast *)0x8;
                          puVar3 = (undefined8 *)__cxa_allocate_exception();
                          pvVar4 = operator_new((ulong)this_00);
                          std::bad_cast::bad_cast(this_00);
                          *puVar3 = pvVar4;
                          __cxa_throw(puVar3,&std::bad_cast*::typeinfo,0);
                        }
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_fffffffffffffc40,
                                   (VarId *)in_stack_fffffffffffffc38);
                        mir::inst::Value::Value
                                  (in_stack_fffffffffffffc40,(VarId *)in_stack_fffffffffffffc38);
                        optimize_func::anon_class_8_1_a7bdd428::operator()
                                  ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                                   in_stack_fffffffffffffc68,
                                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                        mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38)
                        ;
                        optimize_func::anon_class_8_1_a7bdd428::operator()
                                  ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                                   in_stack_fffffffffffffc68,
                                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                      }
                      else {
                        local_270 = &in_stack_fffffffffffffc68[1].field_0x8;
                        local_278._M_current =
                             (VarId *)std::
                                      vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                                      begin((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                             *)in_stack_fffffffffffffc38);
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   in_stack_fffffffffffffc38);
                        while (bVar1 = __gnu_cxx::operator!=
                                                 ((
                                                  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                                                  *)in_stack_fffffffffffffc40,
                                                  (
                                                  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                                                  *)in_stack_fffffffffffffc38), bVar1) {
                          __gnu_cxx::
                          __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                          ::operator*(&local_278);
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_fffffffffffffc40,
                                     (VarId *)in_stack_fffffffffffffc38);
                          mir::inst::VarId::VarId
                                    ((VarId *)in_stack_fffffffffffffc40,
                                     (VarId *)in_stack_fffffffffffffc38);
                          optimize_func::anon_class_8_1_898bcfc2::operator()
                                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                     in_stack_fffffffffffffe94);
                          __gnu_cxx::
                          __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                          ::operator++(&local_278);
                        }
                      }
                    }
                    else {
                      pcVar2 = std::
                               variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::index((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(local_388 + 0x18),(char *)__s,auVar12._8_4_);
                      if (pcVar2 == (char *)0x0) {
                        std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0x138bae);
                        mir::inst::VarId::VarId
                                  ((VarId *)in_stack_fffffffffffffc40,
                                   (VarId *)in_stack_fffffffffffffc38);
                        mir::inst::Value::Value
                                  (in_stack_fffffffffffffc40,(VarId *)in_stack_fffffffffffffc38);
                        optimize_func::anon_class_8_1_a7bdd428::operator()
                                  ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                                   in_stack_fffffffffffffc68,
                                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                      }
                    }
                  }
                  else {
                    mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                    optimize_func::anon_class_8_1_a7bdd428::operator()
                              ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                               in_stack_fffffffffffffc68,
                               (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                    mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                    optimize_func::anon_class_8_1_a7bdd428::operator()
                              ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                               in_stack_fffffffffffffc68,
                               (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                  }
                }
                else {
                  mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                  optimize_func::anon_class_8_1_a7bdd428::operator()
                            ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                             in_stack_fffffffffffffc68,
                             (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                  mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                  optimize_func::anon_class_8_1_a7bdd428::operator()
                            ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                             in_stack_fffffffffffffc68,
                             (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
                }
              }
              else {
                mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                optimize_func::anon_class_8_1_a7bdd428::operator()
                          ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                           in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20)
                          );
              }
            }
            else {
              mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              optimize_func::anon_class_8_1_a7bdd428::operator()
                        ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                         in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
            }
          }
          else {
            mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            optimize_func::anon_class_8_1_a7bdd428::operator()
                      ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                       in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
          }
        }
        else {
          local_d0 = local_328 + 0x38;
          local_d8._M_current =
               (Value *)std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::begin
                                  (in_stack_fffffffffffffc38);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::end
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                     in_stack_fffffffffffffc38);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                                     *)in_stack_fffffffffffffc40,
                                    (__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                                     *)in_stack_fffffffffffffc38), bVar1) {
            __gnu_cxx::
            __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
            ::operator*(&local_d8);
            mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            optimize_func::anon_class_8_1_a7bdd428::operator()
                      ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,
                       in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
            __gnu_cxx::
            __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
            ::operator++(&local_d8);
          }
        }
      }
      else {
        mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        optimize_func::anon_class_8_1_a7bdd428::operator()
                  ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
        mir::inst::Value::Value(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        optimize_func::anon_class_8_1_a7bdd428::operator()
                  ((anon_class_8_1_a7bdd428 *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                   (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_50);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffc40);
  } while( true );
}

Assistant:

void optimize_func(mir::inst::MirFunction &func) {
    auto check = [&](mir::inst::VarId id, int bb) {
      if (func.variables.find(id) == func.variables.end()) {
        LOG(FATAL) << "No such variable: " << id << " (in: " << func.name
                   << ", bb " << bb << ")" << std::endl;
        func.variables.insert(
            {id.id, mir::inst::Variable(mir::types::new_int_ty())});
        // failed = true;
      }
    };
    auto check_val = [&](mir::inst::Value val, int bb) {
      if (auto id = val.get_if<mir::inst::VarId>()) {
        check(*id, bb);
      }
    };
    for (auto &bb : func.basic_blks) {
      for (auto &inst : bb.second.inst) {
        auto &i = *inst;
        check(i.dest, bb.first);
        if (auto x = dynamic_cast<mir::inst::OpInst *>(&i)) {
          check_val(x->lhs, bb.first);
          check_val(x->rhs, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::CallInst *>(&i)) {
          for (auto v : x->params) check_val(v, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::AssignInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::LoadInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::StoreInst *>(&i)) {
          check_val(x->val, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::LoadOffsetInst *>(&i)) {
          check_val(x->src, bb.first);
          check_val(x->offset, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::StoreOffsetInst *>(&i)) {
          check_val(x->val, bb.first);
          check_val(x->offset, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::RefInst *>(&i)) {
          if (x->val.index() == 0)
            check_val(std::get<0>(x->val), bb.first);
          else {
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst *>(&i)) {
          for (auto v : x->vars) check(v, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst *>(&i)) {
          check_val(x->ptr, bb.first);
          check_val(x->offset, bb.first);
        } else {
          throw new std::bad_cast();
        }
      }
    }
  }